

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveLeft2
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double *rhs2,int *ridx2,int rn2)

{
  int iVar1;
  long in_RDI;
  double *in_stack_00000008;
  undefined4 in_stack_00000010;
  double *in_stack_00000048;
  undefined4 in_stack_0000006c;
  CLUFactor<double> *in_stack_00000070;
  
  if (*(int *)(in_RDI + 0xa0) == 0) {
    solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    solveUleft(in_stack_00000070,(double)CONCAT44(in_stack_0000006c,rn2),(double *)ridx2,(int *)rhs2
               ,vec2,(int *)in_stack_00000048,this._4_4_);
    solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,(int *)this,
                   eps._4_4_);
  }
  else {
    solveUleft(in_stack_00000070,(double)CONCAT44(in_stack_0000006c,rn2),(double *)ridx2,(int *)rhs2
               ,vec2,(int *)in_stack_00000048,this._4_4_);
    solveLleftForest(this,eps,vec,idx,rhs._4_4_);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,(int *)this,
                   eps._4_4_);
    solveLleftForestNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
  }
  iVar1 = solveLleft((CLUFactor<double> *)vec2,(double)in_stack_00000048,(double *)this,(int *)eps,
                     vec._4_4_);
  solveLleftNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft2(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2)        /* rhs2    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);

   return rn;
}